

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::RandomNormalDynamicLayerParams::SharedCtor
          (RandomNormalDynamicLayerParams *this)

{
  RandomNormalDynamicLayerParams *this_local;
  
  memset(&this->seed_,0,0x10);
  this->_cached_size_ = 0;
  return;
}

Assistant:

void RandomNormalDynamicLayerParams::SharedCtor() {
  ::memset(&seed_, 0, reinterpret_cast<char*>(&stddev_) -
    reinterpret_cast<char*>(&seed_) + sizeof(stddev_));
  _cached_size_ = 0;
}